

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

int qMetaTypeTypeInternal(QByteArrayView name)

{
  int iVar1;
  int length;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  *typeName;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  *this;
  long in_FS_OFFSET;
  QReadLocker local_28;
  long local_20;
  
  typeName = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
              *)name.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  length = (int)name.m_size;
  if (length == 0) {
    iVar1 = 0;
  }
  else {
    this = typeName;
    iVar1 = qMetaTypeStaticType((char *)typeName,length);
    if (iVar1 == 0) {
      local_28.q_val =
           (quintptr)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
           ::operator()(this);
      QReadLocker::relock(&local_28);
      iVar1 = qMetaTypeCustomType_unlocked((char *)typeName,length);
      QReadLocker::~QReadLocker(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT int qMetaTypeTypeInternal(QByteArrayView name)
{
    return qMetaTypeTypeImpl<DontNormalizeType>(name.data(), name.size());
}